

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shake_test.c
# Opt level: O3

int main(void)

{
  BitSequence *data;
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  int iVar5;
  char *pcVar6;
  uint8_t data2 [8];
  uint8_t data1 [8];
  uint8_t output3 [32];
  uint8_t output2 [32];
  uint8_t output1 [32];
  uint8_t out2 [32];
  uint8_t output4 [32];
  uint8_t out1 [32];
  uint8_t *output_ptrs [4];
  uint8_t *data_ptrs [4];
  hash_context ctx1;
  hash_context_x4 ctx;
  int local_63c;
  BitSequence local_638 [16];
  undefined1 local_628 [32];
  undefined1 local_608 [32];
  undefined1 local_5e8 [32];
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined1 local_5a8 [32];
  undefined8 local_588;
  undefined8 uStack_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  BitSequence *local_568;
  undefined1 *local_560;
  undefined1 *local_558;
  undefined1 *local_550;
  BitSequence *local_548;
  BitSequence *local_540;
  BitSequence *local_538;
  BitSequence *local_530;
  Keccak_HashInstance local_528;
  Keccak_HashInstance local_448;
  Keccak_HashInstancetimes4 local_368;
  
  printf("testing SHAKE128x4 ...");
  data = local_638 + 8;
  local_568 = local_5e8;
  local_560 = local_608;
  local_558 = local_628;
  local_638[8] = '\x01';
  local_638[9] = '#';
  local_638[10] = 'E';
  local_638[0xb] = 'g';
  local_638[0xc] = 0x89;
  local_638[0xd] = 0xab;
  local_638[0xe] = 0xcd;
  local_638[0xf] = 0xef;
  local_628 = ZEXT1632(ZEXT816(0) << 0x40);
  local_608 = ZEXT1632(ZEXT816(0) << 0x40);
  local_638[0] = 0xfe;
  local_638[1] = 0xdc;
  local_638[2] = 0xba;
  local_638[3] = 0x98;
  local_638[4] = 'v';
  local_638[5] = 'T';
  local_638[6] = '2';
  local_638[7] = '\x10';
  local_5e8 = local_628;
  local_5a8 = local_608;
  local_550 = local_5a8;
  local_548 = data;
  local_540 = local_638;
  local_538 = local_638;
  local_530 = data;
  Keccak_HashInitializetimes4(&local_368,0x540,0x100,0,'\x1f');
  Keccak_HashUpdatetimes4(&local_368,&local_548,0x40);
  Keccak_HashFinaltimes4(&local_368,(BitSequence **)0x0);
  Keccak_HashSqueezetimes4(&local_368,&local_568,0x100);
  local_588 = 0;
  uStack_580 = 0;
  uStack_578 = 0;
  uStack_570 = 0;
  local_5c8 = 0;
  uStack_5c0 = 0;
  uStack_5b8 = 0;
  uStack_5b0 = 0;
  Keccak_HashInitialize(&local_448,0x540,0x100,0,'\x1f');
  Keccak_HashUpdate(&local_448,data,0x40);
  Keccak_HashFinal(&local_448,(BitSequence *)0x0);
  Keccak_HashSqueeze(&local_448,(BitSequence *)&local_588,0x100);
  Keccak_HashInitialize(&local_528,0x540,0x100,0,'\x1f');
  Keccak_HashUpdate(&local_528,local_638,0x40);
  Keccak_HashFinal(&local_528,(BitSequence *)0x0);
  Keccak_HashSqueeze(&local_528,(BitSequence *)&local_5c8,0x100);
  auVar3._8_8_ = uStack_580;
  auVar3._0_8_ = local_588;
  auVar3._16_8_ = uStack_578;
  auVar3._24_8_ = uStack_570;
  if ((((auVar3 == _DAT_00114020) &&
       (auVar1._8_8_ = uStack_5c0, auVar1._0_8_ = local_5c8, auVar1._16_8_ = uStack_5b8,
       auVar1._24_8_ = uStack_5b0, auVar1 == _DAT_00114040)) && (local_5e8 == _DAT_00114020)) &&
     ((local_608 == _DAT_00114040 && (local_628 == _DAT_00114040)))) {
    pcVar6 = "OK";
    if (local_5a8 != _DAT_00114020) {
      pcVar6 = "FAILED";
    }
    local_63c = -(uint)(local_5a8 != _DAT_00114020);
  }
  else {
    local_63c = -1;
    pcVar6 = "FAILED";
  }
  puts(pcVar6);
  printf("testing SHAKE256x4 ...");
  local_568 = local_5e8;
  local_638[8] = '\x01';
  local_638[9] = '#';
  local_638[10] = 'E';
  local_638[0xb] = 'g';
  local_638[0xc] = 0x89;
  local_638[0xd] = 0xab;
  local_638[0xe] = 0xcd;
  local_638[0xf] = 0xef;
  local_638[0] = 0xfe;
  local_638[1] = 0xdc;
  local_638[2] = 0xba;
  local_638[3] = 0x98;
  local_638[4] = 'v';
  local_638[5] = 'T';
  local_638[6] = '2';
  local_638[7] = '\x10';
  local_560 = local_608;
  local_558 = local_628;
  local_5e8 = ZEXT1632(ZEXT816(0));
  local_608 = ZEXT1632(ZEXT816(0));
  local_628 = ZEXT1632(ZEXT816(0));
  local_5a8 = ZEXT1632(ZEXT816(0));
  local_550 = local_5a8;
  local_548 = data;
  local_540 = local_638;
  local_538 = local_638;
  local_530 = data;
  Keccak_HashInitializetimes4(&local_368,0x440,0x200,0,'\x1f');
  Keccak_HashUpdatetimes4(&local_368,&local_548,0x40);
  Keccak_HashFinaltimes4(&local_368,(BitSequence **)0x0);
  Keccak_HashSqueezetimes4(&local_368,&local_568,0x100);
  local_588 = 0;
  uStack_580 = 0;
  uStack_578 = 0;
  uStack_570 = 0;
  local_5c8 = 0;
  uStack_5c0 = 0;
  uStack_5b8 = 0;
  uStack_5b0 = 0;
  Keccak_HashInitialize(&local_448,0x440,0x200,0,'\x1f');
  Keccak_HashUpdate(&local_448,data,0x40);
  Keccak_HashFinal(&local_448,(BitSequence *)0x0);
  Keccak_HashSqueeze(&local_448,(BitSequence *)&local_588,0x100);
  Keccak_HashInitialize(&local_528,0x440,0x200,0,'\x1f');
  Keccak_HashUpdate(&local_528,local_638,0x40);
  Keccak_HashFinal(&local_528,(BitSequence *)0x0);
  Keccak_HashSqueeze(&local_528,(BitSequence *)&local_5c8,0x100);
  auVar4._8_8_ = uStack_580;
  auVar4._0_8_ = local_588;
  auVar4._16_8_ = uStack_578;
  auVar4._24_8_ = uStack_570;
  if (((auVar4 == _DAT_00114060) &&
      (auVar2._8_8_ = uStack_5c0, auVar2._0_8_ = local_5c8, auVar2._16_8_ = uStack_5b8,
      auVar2._24_8_ = uStack_5b0, auVar2 == _DAT_00114080)) &&
     ((local_5e8 == _DAT_00114060 && ((local_608 == _DAT_00114080 && (local_628 == _DAT_00114080))))
     )) {
    pcVar6 = "FAILED";
    iVar5 = -1;
    if (local_5a8 == _DAT_00114060) {
      pcVar6 = "OK";
      iVar5 = local_63c;
    }
  }
  else {
    pcVar6 = "FAILED";
    iVar5 = -1;
  }
  puts(pcVar6);
  printf("testing SHAKE128 with valgrind ...");
  puts("SKIPPED");
  return iVar5;
}

Assistant:

int main(void) {
  int ret = 0;

  printf("testing SHAKE128x4 ...");
  int r = test_shake128_x4();
  if (r == -2) {
    printf("SKIPPED\n");
  } else if (r) {
    printf("FAILED\n");
    ret = -1;
  } else {
    printf("OK\n");
  }

  printf("testing SHAKE256x4 ...");
  r = test_shake256_x4();
  if (r == -2) {
    printf("SKIPPED\n");
  } else if (r) {
    printf("FAILED\n");
    ret = -1;
  } else {
    printf("OK\n");
  }

  printf("testing SHAKE128 with valgrind ...");
  r = test_shake128_valgrind();
  if (r == -2) {
    printf("SKIPPED\n");
  } else if (r) {
    printf("FAILED\n");
    ret = -1;
  } else {
    printf("OK\n");
  }

  return ret;
}